

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

void read_bytes<int,short>
               (void *ptr,size_t n_els,FILE **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian)

{
  pointer pcVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  int *ptr_write;
  
  if (n_els == 0) {
    return;
  }
  iVar2 = feof((FILE *)*in);
  if (iVar2 == 0) {
    if ((ulong)((long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start) < n_els * 2) {
      std::vector<char,_std::allocator<char>_>::resize(buffer,n_els * 4);
    }
    sVar3 = fread((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_start,2,n_els,(FILE *)*in);
    if ((sVar3 == n_els) && (iVar2 = ferror((FILE *)*in), iVar2 == 0)) {
      if (diff_endian) {
        read_bytes<int,short>();
      }
      pcVar1 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar4 = 0;
      do {
        *(int *)((long)ptr + sVar4 * 4) = (int)*(short *)(pcVar1 + sVar4 * 2);
        sVar4 = sVar4 + 1;
      } while (n_els != sVar4);
      return;
    }
    throw_ferror(*in);
  }
  throw_feoferr();
}

Assistant:

void read_bytes(void *ptr, const size_t n_els, FILE *&in, std::vector<char> &buffer, const bool diff_endian)
{
    if (std::is_same<dtype, saved_type>::value)
    {
        read_bytes<dtype>(ptr, n_els, in);
        if (unlikely(diff_endian)) swap_endianness((dtype*)ptr, n_els);
        return;
    }
    if (n_els == 0) return;
    if (unlikely(feof(in))) throw_feoferr();
    if (unlikely(buffer.size() < n_els * sizeof(saved_type)))
        buffer.resize((size_t)2 * n_els * sizeof(saved_type));
    size_t n_read = fread(buffer.data(), sizeof(saved_type), n_els, in);
    if (unlikely(n_read != n_els || ferror(in))) throw_ferror(in);

    if (unlikely(diff_endian)) swap_endianness((saved_type*)buffer.data(), n_els);
    convert_dtype<dtype, saved_type>(ptr, buffer, n_els);
}